

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::LineExitDiamondGenerator::rasterize
          (LineExitDiamondGenerator *this,LineExitDiamond *lineDiamonds,int maxDiamonds,
          int *numWritten)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  LineExitDiamond *packet;
  Vector<long,_2> local_c8;
  undefined1 local_b8 [8];
  Vector<long,_2> diamondPosition;
  undefined1 local_a0 [4];
  int diamondNdx;
  SubpixelLineSegment line;
  Vec2 local_70;
  undefined1 local_68 [8];
  Vector<long,_2> pb;
  Vec2 local_48;
  undefined1 local_40 [8];
  Vector<long,_2> pa;
  deInt64 halfPixel;
  int *numWritten_local;
  int maxDiamonds_local;
  LineExitDiamond *lineDiamonds_local;
  LineExitDiamondGenerator *this_local;
  
  pa.m_data[1] = 0x80;
  join_0x00000010_0x00000000_ = tcu::Vector<float,_4>::xy(&this->m_v0);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_48);
  LineRasterUtil::toSubpixelVector((LineRasterUtil *)local_40,&local_48);
  join_0x00000010_0x00000000_ = tcu::Vector<float,_4>::xy(&this->m_v1);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_70);
  LineRasterUtil::toSubpixelVector((LineRasterUtil *)local_68,&local_70);
  LineRasterUtil::SubpixelLineSegment::SubpixelLineSegment
            ((SubpixelLineSegment *)local_a0,(Vector<long,_2> *)local_40,(Vector<long,_2> *)local_68
            );
  diamondPosition.m_data[1]._4_4_ = 0;
  while( true ) {
    piVar3 = tcu::Vector<int,_2>::y(&this->m_curPos);
    iVar1 = *piVar3;
    piVar3 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    if (*piVar3 < iVar1 || maxDiamonds <= diamondPosition.m_data[1]._4_4_) break;
    LineRasterUtil::toSubpixelVector((LineRasterUtil *)&local_c8,&this->m_curPos);
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&packet,0x80,0x80);
    tcu::operator+((tcu *)local_b8,&local_c8,(Vector<long,_2> *)&packet);
    bVar2 = LineRasterUtil::doesLineSegmentExitDiamond
                      ((SubpixelLineSegment *)local_a0,(Vector<long,_2> *)local_b8);
    if (bVar2) {
      *(undefined8 *)lineDiamonds[diamondPosition.m_data[1]._4_4_].position.m_data =
           *(undefined8 *)(this->m_curPos).m_data;
      diamondPosition.m_data[1]._4_4_ = diamondPosition.m_data[1]._4_4_ + 1;
    }
    piVar3 = tcu::Vector<int,_2>::x(&this->m_curPos);
    *piVar3 = *piVar3 + 1;
    piVar3 = tcu::Vector<int,_2>::x(&this->m_curPos);
    iVar1 = *piVar3;
    piVar3 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    if (*piVar3 < iVar1) {
      piVar3 = tcu::Vector<int,_2>::y(&this->m_curPos);
      *piVar3 = *piVar3 + 1;
      piVar3 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
      iVar1 = *piVar3;
      piVar3 = tcu::Vector<int,_2>::x(&this->m_curPos);
      *piVar3 = iVar1;
    }
  }
  *numWritten = diamondPosition.m_data[1]._4_4_;
  return;
}

Assistant:

void LineExitDiamondGenerator::rasterize (LineExitDiamond* const lineDiamonds, const int maxDiamonds, int& numWritten)
{
	DE_ASSERT(maxDiamonds > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy());
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy());
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											diamondNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && diamondNdx < maxDiamonds)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			LineExitDiamond& packet = lineDiamonds[diamondNdx];
			packet.position = m_curPos;
			++diamondNdx;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(diamondNdx <= maxDiamonds);
	numWritten = diamondNdx;
}